

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O2

UnitBoundedPolynomial<5U,_1U> *
UnitBoundedPolynomial<5U,_1U>::fit
          (UnitBoundedPolynomial<5U,_1U> *__return_storage_ptr__,Matrix<double,_1,_3,_1,_1,_3> *A,
          Matrix<double,_1,_3,_1,_1,_3> *B)

{
  Matrix<double,_3,_1,_0,_3,_1> MStack_118;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_100 [24];
  PointerType local_e8 [2];
  XprTypeNested local_d8;
  undefined8 uStack_d0;
  long local_c8;
  Index IStack_c0;
  PointerType local_b8 [2];
  XprTypeNested local_a8;
  undefined8 uStack_a0;
  long local_98;
  Index IStack_90;
  BlockImpl_dense<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1,_3,_true,_true> local_80;
  BlockImpl_dense<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1,_3,_true,_true> local_50;
  
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_50,A,0);
  local_98 = local_50.m_startCol.m_value;
  IStack_90 = local_50.m_outerStride;
  local_a8 = local_50.m_xpr;
  uStack_a0 = local_50._24_8_;
  local_b8[0] = local_50.
                super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1,_3,_true>,_1>.
                super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1,_3,_true>,_0>.
                m_data;
  local_b8[1] = (PointerType)
                local_50.
                super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1,_3,_true>,_1>.
                super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1,_3,_true>,_0>.
                _8_8_;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,1,3,1,1,3>,1,3,true>>>
            (local_100,
             (DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1,_3,_true>_>_>
              *)local_b8);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_80,B,0);
  local_c8 = local_80.m_startCol.m_value;
  IStack_c0 = local_80.m_outerStride;
  local_d8 = local_80.m_xpr;
  uStack_d0 = local_80._24_8_;
  local_e8[0] = local_80.
                super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1,_3,_true>,_1>.
                super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1,_3,_true>,_0>.
                m_data;
  local_e8[1] = (PointerType)
                local_80.
                super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1,_3,_true>,_1>.
                super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1,_3,_true>,_0>.
                _8_8_;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,1,3,1,1,3>,1,3,true>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&MStack_118,
             (DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1,_3,_true>_>_>
              *)local_e8);
  UnitBoundedPolynomial1<5U>::fit((Matrix<double,_3,_1,_0,_3,_1> *)local_100,&MStack_118);
  calculateLength(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

UnitBoundedPolynomial<Order, Dims> UnitBoundedPolynomial<Order, Dims>::fit(Matrix<double, Dims, Poly1::RequiredValues> A, 
                                                                           Matrix<double, Dims, Poly1::RequiredValues> B)
{
    UnitBoundedPolynomial<Order, Dims> out;

    for (int k = 0; k < Dims; ++k)
    {
        out._dims[k] = Poly1::fit(A.row(k).transpose(), B.row(k).transpose());
    }

    out.calculateLength();

    return out;
}